

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  bool bVar1;
  long lVar2;
  long *in_RSI;
  long in_RDI;
  float *ptr;
  int len;
  bool is_array;
  size_t nread;
  int id;
  Allocator *in_stack_ffffffffffffffc8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  clear((ParamDict *)nread);
  uVar4 = 0;
  lVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffe4,4);
  if (lVar2 == 4) {
    do {
      if (uVar4 == 0xffffff17) {
        return 0;
      }
      bVar1 = (int)uVar4 < -0x5b03;
      in_stack_ffffffffffffffd4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
      if (bVar1) {
        uVar4 = 0xffffa4fc - uVar4;
      }
      if (0x1f < (int)uVar4) {
        fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",
                (ulong)uVar4,0x20);
        fprintf(_stderr,"\n");
        return -1;
      }
      if (bVar1) {
        iVar3 = 0;
        lVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffd0,4);
        if (lVar2 != 4) {
          fprintf(_stderr,"ParamDict read array length failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        ncnn::Mat::create((Mat *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),0,
                          CONCAT44(in_stack_ffffffffffffffd4,iVar3),in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffc8 =
             (Allocator *)
             ncnn::Mat::operator_cast_to_float_
                       ((Mat *)(*(long *)(in_RDI + 8) + (long)(int)uVar4 * 0x50 + 8));
        lVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,in_stack_ffffffffffffffc8,(long)iVar3 << 2);
        if (lVar2 != (long)iVar3 * 4) {
          fprintf(_stderr,"ParamDict read array element failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar4 * 0x50) = 4;
      }
      else {
        lVar2 = (**(code **)(*in_RSI + 0x18))
                          (in_RSI,*(long *)(in_RDI + 8) + (long)(int)uVar4 * 0x50 + 4,4);
        if (lVar2 != 4) {
          fprintf(_stderr,"ParamDict read value failed %zd",lVar2);
          fprintf(_stderr,"\n");
          return -1;
        }
        *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar4 * 0x50) = 1;
      }
      lVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffe4,4);
    } while (lVar2 == 4);
    fprintf(_stderr,"ParamDict read EOP failed %zd",lVar2);
    fprintf(_stderr,"\n");
  }
  else {
    fprintf(_stderr,"ParamDict read id failed %zd",lVar2);
    fprintf(_stderr,"\n");
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

    //     binary 0
    //     binary 100
    //     binary 1
    //     binary 1.250000
    //     binary 3 | array_bit
    //     binary 5
    //     binary 0.1
    //     binary 0.2
    //     binary 0.4
    //     binary 0.8
    //     binary 1.0
    //     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

            d->params[id].v.create(len);

            float* ptr = d->params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

            d->params[id].type = 4;
        }
        else
        {
            nread = dr.read(&d->params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

            d->params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }
    }

    return 0;
}